

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilCanon.c
# Opt level: O2

void Map_Var4Test(void)

{
  uint uVar1;
  uint uTruth;
  char *pfRes;
  uint *ptRes;
  char *pCounters;
  char **uPhases;
  unsigned_short *uCanons;
  
  Extra_Truth4VarN(&uCanons,&uPhases,&pCounters,0x10);
  for (uVar1 = 0; uVar1 != 0x10000; uVar1 = uVar1 + 1) {
    uTruth = uVar1;
    Extra_TruthCanonN_rec(4,(uchar *)&uTruth,&ptRes,&pfRes,0);
  }
  return;
}

Assistant:

void Map_Var4Test()
{
    extern void Extra_Truth4VarN( unsigned short ** puCanons, char *** puPhases, char ** ppCounters, int PhaseMax );

    unsigned short * uCanons;
    char ** uPhases;
    char * pCounters;
    int i;
    unsigned * ptRes;
    char * pfRes;
    unsigned uTruth;
    int Count;

    Extra_Truth4VarN( &uCanons, &uPhases, &pCounters, 16 );

    for ( i = 0; i < 256*256; i++ )
    {
        uTruth = i;
        Count =  Extra_TruthCanonFastN( 5, 4, &uTruth, &ptRes, &pfRes );
    }
}